

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

string * __thiscall
MinVR::VRDataIndex::addData
          (string *__return_storage_ptr__,VRDataIndex *this,string *name,
          VRFloatArrayConvertible *object)

{
  VRFloatArray local_38;
  
  (**object->_vptr_VRFloatArrayConvertible)(&local_38,object);
  addData(__return_storage_ptr__,this,name,&local_38);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string addData(const std::string &name, const VRFloatArrayConvertible &object) {
    return addData(name, object.toVRFloatArray());
  }